

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::FboCases::RecreateBuffersTest<16384U>::RecreateBuffersTest
          (RecreateBuffersTest<16384U> *this,Context *context,FboConfig *config,bool rebind)

{
  char *pcVar1;
  string local_a0;
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  FboConfig *pFStack_20;
  bool rebind_local;
  FboConfig *config_local;
  Context *context_local;
  RecreateBuffersTest<16384U> *this_local;
  
  pcVar1 = "no_rebind_";
  if (rebind) {
    pcVar1 = "rebind_";
  }
  local_21 = rebind;
  pFStack_20 = config;
  config_local = (FboConfig *)context;
  context_local = (Context *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,pcVar1,&local_69);
  FboConfig::getName_abi_cxx11_(&local_a0,pFStack_20);
  std::operator+(&local_48,&local_68,&local_a0);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,pcVar1,"Recreate buffers",pFStack_20);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RecreateBuffersTest_032822c0;
  this->m_rebind = (bool)(local_21 & 1);
  return;
}

Assistant:

RecreateBuffersTest<Buffers>::RecreateBuffersTest (Context& context, const FboConfig& config, bool rebind)
	: FboRenderCase		(context, (string(rebind ? "rebind_" : "no_rebind_") + config.getName()).c_str(), "Recreate buffers", config)
	, m_rebind			(rebind)
{
}